

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestScriptHandler.cxx
# Opt level: O3

bool cmCTestScriptHandler::WriteInitialCache(string *directory,string *text)

{
  uint uVar1;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string cacheFile;
  cmGeneratedFileStream fout;
  string local_2a0;
  undefined1 local_280 [16];
  undefined8 local_270;
  char *local_268;
  uint auStack_260 [146];
  
  local_280._8_8_ = (directory->_M_dataplus)._M_p;
  local_280._0_8_ = directory->_M_string_length;
  local_270 = 0xf;
  local_268 = "/CMakeCache.txt";
  views._M_len = 2;
  views._M_array = (iterator)local_280;
  cmCatViews_abi_cxx11_(&local_2a0,views);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_280,&local_2a0,false,None);
  uVar1 = *(uint *)((long)auStack_260 + (long)*(_func_int **)(local_280._0_8_ + -0x18));
  if ((uVar1 & 5) == 0) {
    std::ostream::write(local_280,(long)(text->_M_dataplus)._M_p);
    std::ostream::flush();
    std::ofstream::close();
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_280);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
  }
  return (uVar1 & 5) == 0;
}

Assistant:

bool cmCTestScriptHandler::WriteInitialCache(const std::string& directory,
                                             const std::string& text)
{
  std::string cacheFile = cmStrCat(directory, "/CMakeCache.txt");
  cmGeneratedFileStream fout(cacheFile);
  if (!fout) {
    return false;
  }

  fout.write(text.data(), text.size());

  // Make sure the operating system has finished writing the file
  // before closing it.  This will ensure the file is finished before
  // the check below.
  fout.flush();
  fout.close();
  return true;
}